

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_4.cpp
# Opt level: O2

void __thiscall Date::increment_day(Date *this)

{
  Month MVar1;
  int iVar2;
  Month MVar3;
  int iVar4;
  bool bVar5;
  
  MVar1 = this->m;
  if (MVar1 < (dec|jan)) {
    if ((0x15aaU >> (MVar1 & 0x1f) & 1) != 0) {
      iVar4 = this->d + 1;
      bVar5 = this->d == 0x1f;
      goto LAB_00102500;
    }
    if (MVar1 == feb) {
      bVar5 = is_leap(this);
      iVar2 = this->d;
      iVar4 = iVar2 + 1;
      if (bVar5) {
        bVar5 = iVar2 == 0x1d;
      }
      else {
        bVar5 = iVar2 == 0x1c;
      }
      goto LAB_00102500;
    }
  }
  iVar4 = this->d + 1;
  bVar5 = this->d == 0x1e;
LAB_00102500:
  if (bVar5) {
    iVar4 = 1;
  }
  this->d = iVar4;
  if (iVar4 == 1) {
    MVar3 = MVar1 + jan;
    if (MVar1 == dec) {
      MVar3 = jan;
    }
    this->m = MVar3;
    if (MVar3 == jan) {
      this->y = this->y + 1;
    }
  }
  return;
}

Assistant:

void Date::increment_day()
{
	switch (m)
	{
	case Month::feb:
	{
		if (is_leap(*this))
			d = next_val(29, d);
		else
			d = next_val(28, d);
		break;
	}
	case Month::jan:
	case Month::mar:
	case Month::may:
	case Month::jul:
	case Month::aug:
	case Month::oct:
	case Month::dec:
		d = next_val(31, d);
		break;
	default:
		d = next_val(30, d);
	}

	// handles case when next day is the first day of next month
	if (d == 1)
	{
		m = Month(next_val(12, int(m)));
		if (m == Month::jan)
			++y;
	}
}